

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphMaker.cc
# Opt level: O0

uint64_t kmer_cannonical(uint64_t kmer,uint8_t k)

{
  uint64_t uVar1;
  uint8_t in_SIL;
  uint64_t in_RDI;
  uint64_t rkmer;
  uint64_t local_20;
  
  uVar1 = kmer_reverse(in_RDI,in_SIL);
  local_20 = in_RDI;
  if (uVar1 < in_RDI) {
    local_20 = uVar1;
  }
  return local_20;
}

Assistant:

uint64_t kmer_cannonical(uint64_t kmer, uint8_t k) {
    uint64_t rkmer=kmer_reverse(kmer,k);
    return (rkmer<kmer ? rkmer:kmer);
}